

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::wait_until_socket_is_ready(socket_t sock,time_t sec,time_t usec)

{
  bool bVar1;
  uint __i;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  __fd_mask *p_Var6;
  __fd_mask *p_Var7;
  ulong uVar8;
  socklen_t len;
  int error;
  timeval tv;
  fd_set fdsr;
  fd_set fdsw;
  fd_set fdse;
  
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    fdsr.fds_bits[lVar4] = 0;
  }
  iVar2 = sock / 0x40;
  uVar8 = 1L << ((byte)sock & 0x3f);
  fdsr.fds_bits[iVar2] = fdsr.fds_bits[iVar2] | uVar8;
  lVar4 = 0x10;
  lVar5 = lVar4;
  p_Var6 = fdsr.fds_bits;
  p_Var7 = fdsw.fds_bits;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    *p_Var7 = *p_Var6;
    p_Var6 = p_Var6 + 1;
    p_Var7 = p_Var7 + 1;
  }
  p_Var6 = fdsr.fds_bits;
  p_Var7 = fdse.fds_bits;
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    *p_Var7 = *p_Var6;
    p_Var6 = p_Var6 + 1;
    p_Var7 = p_Var7 + 1;
  }
  tv.tv_sec = sec;
  tv.tv_usec = usec;
  iVar3 = select(sock + 1,(fd_set *)&fdsr,(fd_set *)&fdsw,(fd_set *)&fdse,(timeval *)&tv);
  if ((iVar3 < 1) ||
     (((fdsr.fds_bits[iVar2] & uVar8) == 0 && ((fdsw.fds_bits[iVar2] & uVar8) == 0)))) {
    bVar1 = false;
  }
  else {
    error = 0;
    len = 4;
    iVar2 = getsockopt(sock,1,4,&error,&len);
    bVar1 = error == 0 && -1 < iVar2;
  }
  return bVar1;
}

Assistant:

inline bool wait_until_socket_is_ready(socket_t sock, time_t sec, time_t usec) {
#ifdef CPPHTTPLIB_USE_POLL
  struct pollfd pfd_read;
  pfd_read.fd = sock;
  pfd_read.events = POLLIN | POLLOUT;

  auto timeout = static_cast<int>(sec * 1000 + usec / 1000);

  if (poll(&pfd_read, 1, timeout) > 0 &&
      pfd_read.revents & (POLLIN | POLLOUT)) {
    int error = 0;
    socklen_t len = sizeof(error);
    return getsockopt(sock, SOL_SOCKET, SO_ERROR,
                      reinterpret_cast<char *>(&error), &len) >= 0 &&
           !error;
  }
  return false;
#else
  fd_set fdsr;
  FD_ZERO(&fdsr);
  FD_SET(sock, &fdsr);

  auto fdsw = fdsr;
  auto fdse = fdsr;

  timeval tv;
  tv.tv_sec = static_cast<long>(sec);
  tv.tv_usec = static_cast<long>(usec);

  if (select(static_cast<int>(sock + 1), &fdsr, &fdsw, &fdse, &tv) > 0 &&
      (FD_ISSET(sock, &fdsr) || FD_ISSET(sock, &fdsw))) {
    int error = 0;
    socklen_t len = sizeof(error);
    return getsockopt(sock, SOL_SOCKET, SO_ERROR,
                      reinterpret_cast<char *>(&error), &len) >= 0 &&
           !error;
  }
  return false;
#endif
}